

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_ManComputeForwardDirconObj(Of_Man_t *p,int iObj)

{
  int iVar1;
  int local_48;
  int local_44;
  int Delay2This;
  int Delay1This;
  int *pList;
  int *pCutMin2;
  int *pCutMin;
  int *pCut;
  int i;
  int Delay2;
  int Delay1;
  int iObj_local;
  Of_Man_t *p_local;
  
  i = 1000000000;
  pCut._4_4_ = 1000000000;
  pCutMin2 = (int *)0x0;
  pList = (int *)0x0;
  Delay2 = iObj;
  _Delay1 = p;
  _Delay2This = Of_ObjCutSet(p,iObj);
  pCut._0_4_ = 0;
  pCutMin = _Delay2This + 1;
  while ((int)pCut < *_Delay2This) {
    Of_ManComputeForwardDirconCut(_Delay1,Delay2,pCutMin,&local_44,&local_48);
    if (local_44 < i) {
      pCutMin2 = pCutMin;
    }
    if (local_48 < pCut._4_4_) {
      pList = pCutMin;
    }
    i = Abc_MinInt(i,local_44);
    pCut._4_4_ = Abc_MinInt(pCut._4_4_,local_48);
    pCut._0_4_ = (int)pCut + 1;
    iVar1 = Of_CutSize(pCutMin);
    pCutMin = pCutMin + (iVar1 + 4);
  }
  Of_ObjSetDelay1(_Delay1,Delay2,i);
  Of_ObjSetDelay2(_Delay1,Delay2,pCut._4_4_);
  Of_ObjSetCutBestP(_Delay1,_Delay2This,Delay2,pCutMin2);
  Of_ObjSetCutBestP2(_Delay1,_Delay2This,Delay2,pList);
  return i;
}

Assistant:

int Of_ManComputeForwardDirconObj( Of_Man_t * p, int iObj )
{
    int Delay1 = ABC_INFINITY, Delay2 = ABC_INFINITY;
    int i, * pCut, * pCutMin = NULL, * pCutMin2 = NULL, * pList = Of_ObjCutSet(p, iObj);
    Of_SetForEachCut( pList, pCut, i )
    {
        int Delay1This, Delay2This;
        Of_ManComputeForwardDirconCut( p, iObj, pCut, &Delay1This, &Delay2This );
        if ( Delay1 > Delay1This )
            pCutMin = pCut;
        if ( Delay2 > Delay2This )
            pCutMin2 = pCut;
        Delay1 = Abc_MinInt( Delay1, Delay1This );
        Delay2 = Abc_MinInt( Delay2, Delay2This );
    }
    Of_ObjSetDelay1( p, iObj, Delay1 );
    Of_ObjSetDelay2( p, iObj, Delay2 );
    Of_ObjSetCutBestP( p, pList, iObj, pCutMin );
    Of_ObjSetCutBestP2( p, pList, iObj, pCutMin2 );
    return Delay1;
}